

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

void duckdb::ListGenericFold<double,duckdb::InnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  double *pdVar4;
  data_ptr_t pdVar5;
  list_entry_t *plVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  double dVar9;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  bool bVar10;
  BoundFunctionExpression *pBVar11;
  string *psVar12;
  reference vec;
  reference vec_00;
  idx_t iVar13;
  idx_t iVar14;
  Vector *this_00;
  Vector *this_01;
  ulong uVar15;
  InvalidInputException *pIVar16;
  ulong uVar17;
  idx_t iVar18;
  uint64_t *puVar19;
  ValidityMask *in_R8;
  idx_t in_R9;
  ulong uVar20;
  ulong uVar21;
  idx_t count;
  idx_t i;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat local_c8;
  double *rhs_data;
  double *lhs_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar11 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  psVar12 = &(pBVar11->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  count = args->count;
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vec_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  iVar13 = ListVector::GetListSize(vec);
  iVar14 = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this_00,iVar13);
  Vector::Flatten(this_01,iVar14);
  FlatVector::VerifyFlatVector(this_00);
  bVar10 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,iVar13);
  if (!bVar10) {
    pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&ldata,"%s: left argument can not contain NULL values",
               (allocator *)&local_c8);
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar12);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar16,(string *)&ldata,&local_50);
    __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_01);
  bVar10 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                     (&(this_01->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
  if (!bVar10) {
    pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&ldata,"%s: right argument can not contain NULL values",
               (allocator *)&local_c8);
    ::std::__cxx11::string::string((string *)&local_70,(string *)psVar12);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar16,(string *)&ldata,&local_70);
    __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lhs_data = (double *)this_00->data;
  rhs_data = (double *)this_01->data;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = (double *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      fun_01.lhs_data = &lhs_data;
      fun_01.func_name = psVar12;
      fun_01.rhs_data = &rhs_data;
      dVar9 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                        (fun_01,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9
                        );
      *pdVar4 = dVar9;
      goto LAB_00ceaeb3;
    }
  }
  else {
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar5 = vec->data;
      plVar6 = (list_entry_t *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vec->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar19 = (uint64_t *)(pdVar5 + 8);
          for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
            fun_05.lhs_data = &lhs_data;
            fun_05.func_name = psVar12;
            fun_05.rhs_data = &rhs_data;
            left_02.length = *puVar19;
            left_02.offset = puVar19[-1];
            dVar9 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                              (fun_05,left_02,*plVar6,in_R8,in_R9);
            *(double *)(pdVar7 + iVar13 * 8) = dVar9;
            puVar19 = puVar19 + 2;
          }
        }
        else {
          uVar20 = 0;
          for (uVar17 = 0; uVar17 != count + 0x3f >> 6; uVar17 = uVar17 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar21 = uVar20 + 0x40;
              if (count <= uVar20 + 0x40) {
                uVar21 = count;
              }
LAB_00cea94d:
              puVar19 = (uint64_t *)(pdVar5 + uVar20 * 0x10 + 8);
              for (; uVar15 = uVar20, uVar20 < uVar21; uVar20 = uVar20 + 1) {
                fun.lhs_data = &lhs_data;
                fun.func_name = psVar12;
                fun.rhs_data = &rhs_data;
                left.length = *puVar19;
                left.offset = puVar19[-1];
                dVar9 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                  (fun,left,*plVar6,in_R8,in_R9);
                *(double *)(pdVar7 + uVar20 * 8) = dVar9;
                puVar19 = puVar19 + 2;
              }
            }
            else {
              uVar23 = puVar3[uVar17];
              uVar21 = uVar20 + 0x40;
              if (count <= uVar20 + 0x40) {
                uVar21 = count;
              }
              if (uVar23 == 0xffffffffffffffff) goto LAB_00cea94d;
              uVar15 = uVar21;
              if (uVar23 != 0) {
                puVar19 = (uint64_t *)(pdVar5 + uVar20 * 0x10 + 8);
                for (uVar22 = 0; uVar15 = uVar20 + uVar22, uVar20 + uVar22 < uVar21;
                    uVar22 = uVar22 + 1) {
                  if ((uVar23 >> (uVar22 & 0x3f) & 1) != 0) {
                    fun_00.lhs_data = &lhs_data;
                    fun_00.func_name = psVar12;
                    fun_00.rhs_data = &rhs_data;
                    left_00.length = *puVar19;
                    left_00.offset = puVar19[-1];
                    dVar9 = BinaryLambdaWrapperWithNulls::
                            Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                      (fun_00,left_00,*plVar6,in_R8,in_R9);
                    *(double *)(pdVar7 + uVar22 * 8 + uVar20 * 8) = dVar9;
                  }
                  puVar19 = puVar19 + 2;
                }
              }
            }
            uVar20 = uVar15;
          }
        }
        goto LAB_00ceaeb3;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar5 = vec->data;
          pdVar7 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar8 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vec);
          TemplatedValidityMask<unsigned_long>::Copy
                    (&this->super_TemplatedValidityMask<unsigned_long>,
                     &(vec->validity).super_TemplatedValidityMask<unsigned_long>,count);
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          FlatVector::VerifyFlatVector(vec_00);
          if (puVar3 == (unsigned_long *)0x0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (&this->super_TemplatedValidityMask<unsigned_long>,
                       &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
          }
          else {
            ValidityMask::Combine(this,&vec_00->validity,count);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            lVar25 = 0;
            while (bVar10 = count != 0, count = count - 1, bVar10) {
              fun_10.lhs_data = &lhs_data;
              fun_10.func_name = psVar12;
              fun_10.rhs_data = &rhs_data;
              left_06.length = *(uint64_t *)(pdVar5 + lVar25 * 2 + 8);
              left_06.offset = *(uint64_t *)(pdVar5 + lVar25 * 2);
              right_06.length = *(uint64_t *)(pdVar7 + lVar25 * 2 + 8);
              right_06.offset = *(uint64_t *)(pdVar7 + lVar25 * 2);
              dVar9 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                (fun_10,left_06,right_06,in_R8,in_R9);
              *(double *)(pdVar8 + lVar25) = dVar9;
              lVar25 = lVar25 + 8;
            }
          }
          else {
            uVar20 = 0;
            for (uVar17 = 0; uVar17 != count + 0x3f >> 6; uVar17 = uVar17 + 1) {
              puVar3 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar21 = uVar20 + 0x40;
                if (count <= uVar20 + 0x40) {
                  uVar21 = count;
                }
LAB_00ceafbd:
                uVar23 = uVar20 << 4 | 8;
                for (; uVar15 = uVar20, uVar20 < uVar21; uVar20 = uVar20 + 1) {
                  fun_08.lhs_data = &lhs_data;
                  fun_08.func_name = psVar12;
                  fun_08.rhs_data = &rhs_data;
                  left_04.length = *(uint64_t *)(pdVar5 + uVar23);
                  left_04.offset = *(uint64_t *)(pdVar5 + (uVar23 - 8));
                  right_04.length = *(uint64_t *)(pdVar7 + uVar23);
                  right_04.offset = *(uint64_t *)(pdVar7 + (uVar23 - 8));
                  dVar9 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                    (fun_08,left_04,right_04,in_R8,in_R9);
                  *(double *)(pdVar8 + uVar20 * 8) = dVar9;
                  uVar23 = uVar23 + 0x10;
                }
              }
              else {
                uVar23 = puVar3[uVar17];
                uVar21 = uVar20 + 0x40;
                if (count <= uVar20 + 0x40) {
                  uVar21 = count;
                }
                if (uVar23 == 0xffffffffffffffff) goto LAB_00ceafbd;
                uVar15 = uVar21;
                if (uVar23 != 0) {
                  uVar24 = uVar20 << 4 | 8;
                  for (uVar22 = 0; uVar15 = uVar20 + uVar22, uVar20 + uVar22 < uVar21;
                      uVar22 = uVar22 + 1) {
                    if ((uVar23 >> (uVar22 & 0x3f) & 1) != 0) {
                      fun_09.lhs_data = &lhs_data;
                      fun_09.func_name = psVar12;
                      fun_09.rhs_data = &rhs_data;
                      left_05.length = *(uint64_t *)(pdVar5 + uVar24);
                      left_05.offset = *(uint64_t *)(pdVar5 + (uVar24 - 8));
                      right_05.length = *(uint64_t *)(pdVar7 + uVar24);
                      right_05.offset = *(uint64_t *)(pdVar7 + (uVar24 - 8));
                      dVar9 = BinaryLambdaWrapperWithNulls::
                              Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                        (fun_09,left_05,right_05,in_R8,in_R9);
                      *(double *)(pdVar8 + uVar22 * 8 + uVar20 * 8) = dVar9;
                    }
                    uVar24 = uVar24 + 0x10;
                  }
                }
              }
              uVar20 = uVar15;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,count,&ldata);
          Vector::ToUnifiedFormat(vec_00,count,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar5 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
              iVar14 = iVar13;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(ldata.sel)->sel_vector[iVar13];
              }
              iVar18 = iVar13;
              if ((local_c8.sel)->sel_vector != (sel_t *)0x0) {
                iVar18 = (idx_t)(local_c8.sel)->sel_vector[iVar13];
              }
              fun_02.lhs_data = &lhs_data;
              fun_02.func_name = psVar12;
              fun_02.rhs_data = &rhs_data;
              left_01.length = *(uint64_t *)(ldata.data + iVar14 * 0x10 + 8);
              left_01.offset = *(uint64_t *)(ldata.data + iVar14 * 0x10);
              right.length = *(uint64_t *)(local_c8.data + iVar18 * 0x10 + 8);
              right.offset = *(uint64_t *)(local_c8.data + iVar18 * 0x10);
              dVar9 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                (fun_02,left_01,right,in_R8,in_R9);
              *(double *)(pdVar5 + iVar13 * 8) = dVar9;
            }
          }
          else {
            for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
              iVar14 = iVar13;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(ldata.sel)->sel_vector[iVar13];
              }
              iVar18 = iVar13;
              if ((local_c8.sel)->sel_vector != (sel_t *)0x0) {
                iVar18 = (idx_t)(local_c8.sel)->sel_vector[iVar13];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar18 >> 6] >> (iVar18 & 0x3f) & 1) != 0)))) {
                fun_06.lhs_data = &lhs_data;
                fun_06.func_name = psVar12;
                fun_06.rhs_data = &rhs_data;
                left_03.length = *(uint64_t *)(ldata.data + iVar14 * 0x10 + 8);
                left_03.offset = *(uint64_t *)(ldata.data + iVar14 * 0x10);
                right_02.length = *(uint64_t *)(local_c8.data + iVar18 * 0x10 + 8);
                right_02.offset = *(uint64_t *)(local_c8.data + iVar18 * 0x10);
                dVar9 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                  (fun_06,left_03,right_02,in_R8,in_R9);
                *(double *)(pdVar5 + iVar13 * 8) = dVar9;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar13);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_00ceaeb3;
      }
      plVar6 = (list_entry_t *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar5 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar19 = (uint64_t *)(pdVar5 + 8);
          for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
            fun_07.lhs_data = &lhs_data;
            fun_07.func_name = psVar12;
            fun_07.rhs_data = &rhs_data;
            right_03.length = *puVar19;
            right_03.offset = puVar19[-1];
            dVar9 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                              (fun_07,*plVar6,right_03,in_R8,in_R9);
            *(double *)(pdVar7 + iVar13 * 8) = dVar9;
            puVar19 = puVar19 + 2;
          }
        }
        else {
          uVar20 = 0;
          for (uVar17 = 0; uVar17 != count + 0x3f >> 6; uVar17 = uVar17 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar21 = uVar20 + 0x40;
              if (count <= uVar20 + 0x40) {
                uVar21 = count;
              }
LAB_00ceac49:
              puVar19 = (uint64_t *)(pdVar5 + uVar20 * 0x10 + 8);
              for (; uVar15 = uVar20, uVar20 < uVar21; uVar20 = uVar20 + 1) {
                fun_03.lhs_data = &lhs_data;
                fun_03.func_name = psVar12;
                fun_03.rhs_data = &rhs_data;
                right_00.length = *puVar19;
                right_00.offset = puVar19[-1];
                dVar9 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                  (fun_03,*plVar6,right_00,in_R8,in_R9);
                *(double *)(pdVar7 + uVar20 * 8) = dVar9;
                puVar19 = puVar19 + 2;
              }
            }
            else {
              uVar23 = puVar3[uVar17];
              uVar21 = uVar20 + 0x40;
              if (count <= uVar20 + 0x40) {
                uVar21 = count;
              }
              if (uVar23 == 0xffffffffffffffff) goto LAB_00ceac49;
              uVar15 = uVar21;
              if (uVar23 != 0) {
                puVar19 = (uint64_t *)(pdVar5 + uVar20 * 0x10 + 8);
                for (uVar22 = 0; uVar15 = uVar22 + uVar20, uVar22 + uVar20 < uVar21;
                    uVar22 = uVar22 + 1) {
                  if ((uVar23 >> (uVar22 & 0x3f) & 1) != 0) {
                    fun_04.lhs_data = &lhs_data;
                    fun_04.func_name = psVar12;
                    fun_04.rhs_data = &rhs_data;
                    right_01.length = *puVar19;
                    right_01.offset = puVar19[-1];
                    dVar9 = BinaryLambdaWrapperWithNulls::
                            Operation<duckdb::ListGenericFold<double,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                      (fun_04,*plVar6,right_01,in_R8,in_R9);
                    *(double *)(pdVar7 + uVar22 * 8 + uVar20 * 8) = dVar9;
                  }
                  puVar19 = puVar19 + 2;
                }
              }
            }
            uVar20 = uVar15;
          }
        }
        goto LAB_00ceaeb3;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00ceaeb3:
  bVar10 = DataChunk::AllConstant(args);
  if (bVar10) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}